

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O1

bool __thiscall
llbuild::buildsystem::ShellCommand::configureAttribute
          (ShellCommand *this,ConfigureContext *ctx,StringRef name,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> values)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pair<llvm::StringRef,_llvm::StringRef> *ppVar4;
  pair<llvm::StringRef,_llvm::StringRef> *ppVar5;
  ulong MinCapacity;
  iterator __begin2;
  pair<llvm::StringRef,_llvm::StringRef> local_50;
  
  MinCapacity = values.Length;
  ppVar5 = values.Data;
  if ((name.Length == 3) &&
     ((char)*(short *)((long)name.Data + 2) == 'v' && *(short *)name.Data == 0x6e65)) {
    (this->env).super_SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>.
    super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>.
    super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>.
    super_SmallVectorBase.Size = 0;
    if ((this->env).super_SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>.
        super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>.
        super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>.
        super_SmallVectorBase.Capacity < MinCapacity) {
      llvm::SmallVectorBase::grow_pod
                ((SmallVectorBase *)&this->env,
                 &(this->env).
                  super_SmallVectorStorage<std::pair<llvm::StringRef,_llvm::StringRef>,_1U>,
                 MinCapacity,0x20);
    }
    if (MinCapacity != 0) {
      ppVar4 = ppVar5 + MinCapacity;
      do {
        iVar2 = (*ctx->delegate->_vptr_BuildFileDelegate[2])
                          (ctx->delegate,(ppVar5->first).Data,(ppVar5->first).Length);
        iVar3 = (*ctx->delegate->_vptr_BuildFileDelegate[2])
                          (ctx->delegate,(ppVar5->second).Data,(ppVar5->second).Length);
        local_50.second.Data = (char *)CONCAT44(extraout_var_00,iVar3);
        local_50.first.Data = (char *)CONCAT44(extraout_var,iVar2);
        llvm::SmallVectorImpl<std::pair<llvm::StringRef,llvm::StringRef>>::
        emplace_back<std::pair<llvm::StringRef,llvm::StringRef>>
                  ((SmallVectorImpl<std::pair<llvm::StringRef,llvm::StringRef>> *)&this->env,
                   &local_50);
        ppVar5 = ppVar5 + 1;
      } while (ppVar5 != ppVar4);
    }
    return true;
  }
  bVar1 = ExternalCommand::configureAttribute(&this->super_ExternalCommand,ctx,name,values);
  return bVar1;
}

Assistant:

bool ShellCommand::configureAttribute(
    const ConfigureContext& ctx, StringRef name,
    ArrayRef<std::pair<StringRef, StringRef>> values) {
  if (name == "env") {
    env.clear();
    env.reserve(values.size());
    for (const auto& entry: values) {
      env.emplace_back(
          std::make_pair(
              ctx.getDelegate().getInternedString(entry.first),
              ctx.getDelegate().getInternedString(entry.second)));
    }
  } else {
    return ExternalCommand::configureAttribute(ctx, name, values);
  }

  return true;
}